

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unfold.cpp
# Opt level: O0

int __thiscall ncnn::Unfold::forward(Unfold *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined8 *in_RCX;
  long *in_RDX;
  long in_RDI;
  bool bVar1;
  int j;
  int i;
  float *sptr;
  int v;
  int u;
  float *ptr;
  Mat img;
  int p;
  int gap;
  int maxk;
  int size;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Option opt_b;
  Mat bottom_blob_bordered;
  Mat *m;
  Allocator *in_stack_fffffffffffffce8;
  void **ppvVar2;
  size_t in_stack_fffffffffffffcf0;
  undefined8 in_stack_fffffffffffffcf8;
  Mat *in_stack_fffffffffffffd00;
  bool local_2b9;
  int local_2a8;
  int local_2a4;
  undefined4 *local_2a0;
  int local_298;
  int local_294;
  undefined4 *local_290;
  undefined8 local_288;
  undefined8 local_280;
  undefined8 local_278;
  undefined4 local_270;
  long *local_268;
  undefined4 local_260;
  undefined4 local_25c;
  undefined4 local_258;
  undefined4 local_254;
  undefined4 local_250;
  undefined8 local_248;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  int local_230;
  int local_22c;
  int local_228;
  int local_224;
  long local_220;
  int local_214;
  int local_210;
  int local_20c;
  undefined4 local_208;
  Option *in_stack_fffffffffffffe00;
  void *local_1b8;
  int *local_1b0;
  long local_1a8;
  undefined4 local_1a0;
  long *local_198;
  undefined4 local_190;
  int local_18c;
  int local_188;
  undefined4 local_184;
  int local_180;
  long local_178;
  long *local_168;
  int local_14c;
  void **local_148;
  long *local_140;
  void **local_138;
  undefined1 local_12d;
  int local_12c;
  void **local_128;
  undefined8 *local_120;
  int local_114;
  int local_104;
  undefined8 *local_100;
  undefined8 *local_f0;
  void **local_e0;
  void **local_d0;
  long *local_c8;
  long *local_c0;
  undefined4 local_b4;
  void *local_a8;
  undefined4 local_9c;
  undefined8 *local_90;
  undefined4 local_84;
  long local_80;
  int local_68;
  undefined4 local_64;
  void **local_60;
  undefined8 *local_40;
  void *local_10;
  
  local_148 = &local_1b8;
  local_1b8 = (void *)0x0;
  local_1b0 = (int *)0x0;
  local_1a8 = 0;
  local_1a0 = 0;
  local_198 = (long *)0x0;
  local_190 = 0;
  local_18c = 0;
  local_188 = 0;
  local_184 = 0;
  local_180 = 0;
  local_178 = 0;
  local_168 = in_RDX;
  make_padding((Unfold *)in_RCX[2],(Mat *)in_RCX[2],(Mat *)*in_RCX,in_stack_fffffffffffffe00);
  local_138 = &local_1b8;
  if (local_1b8 != (void *)0x0) {
    local_d0 = local_138;
  }
  local_2b9 = local_1b8 != (void *)0x0 && local_178 * local_180 != 0;
  if (local_2b9) {
    local_20c = local_18c;
    local_210 = local_188;
    local_214 = local_180;
    local_220 = local_1a8;
    local_224 = *(int *)(in_RDI + 0xd8) * (*(int *)(in_RDI + 0xd0) + -1) + 1;
    local_228 = *(int *)(in_RDI + 0xdc) * (*(int *)(in_RDI + 0xd4) + -1) + 1;
    local_22c = (local_18c - local_224) / *(int *)(in_RDI + 0xe0) + 1;
    local_230 = (local_188 - local_228) / *(int *)(in_RDI + 0xe4) + 1;
    local_234 = local_22c * local_230;
    local_238 = *(int *)(in_RDI + 0xd0) * *(int *)(in_RDI + 0xd4);
    Mat::create(in_stack_fffffffffffffd00,(int)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                (int)in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8);
    local_140 = local_168;
    bVar1 = true;
    if (*local_168 != 0) {
      local_c8 = local_168;
      bVar1 = local_168[8] * (long)(int)local_168[7] == 0;
    }
    if (bVar1) {
      local_14c = -100;
    }
    else {
      local_23c = local_20c * *(int *)(in_RDI + 0xe4) - local_22c * *(int *)(in_RDI + 0xe0);
      for (local_240 = 0; local_240 < local_214; local_240 = local_240 + 1) {
        local_120 = &local_288;
        local_128 = &local_1b8;
        local_a8 = (void *)((long)local_1b8 + local_178 * local_240 * local_1a8);
        local_90 = &local_288;
        local_80 = (long)local_18c * (long)local_188 * local_1a8;
        local_114 = local_240 * local_238;
        local_290 = (undefined4 *)
                    (*local_168 +
                    (long)*(int *)((long)local_168 + 0x2c) * (long)local_114 * local_168[2]);
        for (local_294 = 0; local_294 < *(int *)(in_RDI + 0xd4); local_294 = local_294 + 1) {
          for (local_298 = 0; local_298 < *(int *)(in_RDI + 0xd0); local_298 = local_298 + 1) {
            local_104 = *(int *)(in_RDI + 0xdc) * local_294;
            local_100 = &local_288;
            local_2a0 = (undefined4 *)
                        ((long)local_a8 +
                        (long)(*(int *)(in_RDI + 0xd8) * local_298) * 4 +
                        (long)local_18c * (long)local_104 * local_1a8);
            for (local_2a4 = 0; local_2a4 < local_230; local_2a4 = local_2a4 + 1) {
              for (local_2a8 = 0; local_2a8 < local_22c; local_2a8 = local_2a8 + 1) {
                *local_290 = *local_2a0;
                local_2a0 = local_2a0 + *(int *)(in_RDI + 0xe0);
                local_290 = local_290 + 1;
              }
              local_2a0 = local_2a0 + local_23c;
            }
          }
        }
        local_f0 = &local_288;
        local_268 = local_198;
        local_84 = 0x10;
        local_9c = local_184;
        local_b4 = local_1a0;
        local_c0 = local_198;
        local_12c = local_240;
        local_12d = 1;
        local_288 = 0;
        local_278 = 0;
        local_270 = 0;
        local_260 = 0;
        local_25c = 0;
        local_258 = 0;
        local_254 = 0;
        local_250 = 0;
        local_248 = 0;
        local_280 = 0;
        local_40 = local_f0;
      }
      local_14c = 0;
    }
  }
  else {
    local_14c = -100;
  }
  local_208 = 1;
  ppvVar2 = &local_1b8;
  if (local_1b0 != (int *)0x0) {
    local_64 = 0xffffffff;
    LOCK();
    local_68 = *local_1b0;
    *local_1b0 = *local_1b0 + -1;
    UNLOCK();
    if (local_68 == 1) {
      local_e0 = ppvVar2;
      local_60 = ppvVar2;
      if (local_198 == (long *)0x0) {
        local_10 = local_1b8;
        if (local_1b8 != (void *)0x0) {
          free(local_1b8);
        }
      }
      else {
        (**(code **)(*local_198 + 0x18))(local_198,local_1b8);
      }
    }
  }
  *ppvVar2 = (void *)0x0;
  ppvVar2[2] = (void *)0x0;
  *(undefined4 *)(ppvVar2 + 3) = 0;
  *(undefined4 *)(ppvVar2 + 5) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x2c) = 0;
  *(undefined4 *)(ppvVar2 + 6) = 0;
  *(undefined4 *)((long)ppvVar2 + 0x34) = 0;
  *(undefined4 *)(ppvVar2 + 7) = 0;
  ppvVar2[8] = (void *)0x0;
  ppvVar2[1] = (void *)0x0;
  return local_14c;
}

Assistant:

int Unfold::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    Mat bottom_blob_bordered;
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        opt_b.use_packing_layout = false;
        make_padding(bottom_blob, bottom_blob_bordered, opt_b);
        if (bottom_blob_bordered.empty())
            return -100;
    }

    const int w = bottom_blob_bordered.w;
    const int h = bottom_blob_bordered.h;
    const int channels = bottom_blob_bordered.c;
    const size_t elemsize = bottom_blob_bordered.elemsize;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = (h - kernel_extent_h) / stride_h + 1;

    const int size = outw * outh;
    const int maxk = kernel_w * kernel_h;

    top_blob.create(size, maxk * channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // im2col
    const int gap = w * stride_h - outw * stride_w;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < channels; p++)
    {
        const Mat img = bottom_blob_bordered.channel(p);
        float* ptr = top_blob.row(p * maxk);

        for (int u = 0; u < kernel_h; u++)
        {
            for (int v = 0; v < kernel_w; v++)
            {
                const float* sptr = img.row(dilation_h * u) + dilation_w * v;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        ptr[0] = sptr[0];

                        sptr += stride_w;
                        ptr += 1;
                    }

                    sptr += gap;
                }
            }
        }
    }

    return 0;
}